

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20250127::Cord::InlineRep::AssignSlow(InlineRep *this,InlineRep *src)

{
  bool bVar1;
  Nonnull<absl::cord_internal::CordRep_*> pCVar2;
  CordRep *pCVar3;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordzInfo *this_00;
  
  if (src == this) {
    __assert_fail("&src != this",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                  ,0x132,"void absl::Cord::InlineRep::AssignSlow(const Cord::InlineRep &)");
  }
  if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
    if (((src->data_).rep_.field_0.data[0] & 1U) != 0) {
      pCVar2 = as_tree(src);
      pCVar3 = cord_internal::CordRep::Ref(pCVar2);
      EmplaceTree(this,pCVar3,&src->data_,kAssignCord);
      return;
    }
    __assert_fail("is_tree() || src.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                  ,0x133,"void absl::Cord::InlineRep::AssignSlow(const Cord::InlineRep &)");
  }
  pCVar2 = as_tree(this);
  rep = tree(src);
  if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    this_00 = cord_internal::InlineData::cordz_info(&this->data_);
    if (this_00 != (CordzInfo *)0x0) {
      cord_internal::CordzInfo::Untrack(this_00);
    }
    pCVar3 = (src->data_).rep_.field_0.as_tree.rep;
    (this->data_).rep_.field_0.as_tree.cordz_info = (src->data_).rep_.field_0.as_tree.cordz_info;
    (this->data_).rep_.field_0.as_tree.rep = pCVar3;
  }
  else {
    LOCK();
    (rep->refcount).count_.super___atomic_base<int>._M_i =
         (rep->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    cord_internal::InlineData::set_tree(&this->data_,rep);
    bVar1 = cord_internal::InlineData::is_either_profiled(&this->data_,&src->data_);
    if (bVar1) {
      cord_internal::CordzInfo::MaybeTrackCordImpl(&this->data_,&src->data_,kAssignCord);
    }
  }
  cord_internal::CordRep::Unref(pCVar2);
  return;
}

Assistant:

void Cord::InlineRep::AssignSlow(const Cord::InlineRep& src) {
  assert(&src != this);
  assert(is_tree() || src.is_tree());
  auto constexpr method = CordzUpdateTracker::kAssignCord;
  if (ABSL_PREDICT_TRUE(!is_tree())) {
    EmplaceTree(CordRep::Ref(src.as_tree()), src.data_, method);
    return;
  }

  CordRep* tree = as_tree();
  if (CordRep* src_tree = src.tree()) {
    // Leave any existing `cordz_info` in place, and let MaybeTrackCord()
    // decide if this cord should be (or remains to be) sampled or not.
    data_.set_tree(CordRep::Ref(src_tree));
    CordzInfo::MaybeTrackCord(data_, src.data_, method);
  } else {
    CordzInfo::MaybeUntrackCord(data_.cordz_info());
    data_ = src.data_;
  }
  CordRep::Unref(tree);
}